

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRet.c
# Opt level: O2

void Rtm_ObjRetimeFwd(Rtm_Man_t *pRtm,Rtm_Obj_t *pObj)

{
  uint *puVar1;
  Rtm_Edg_t *pRVar2;
  int iVar3;
  uint uVar4;
  uint *puVar5;
  uint uVar6;
  char *__function;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  char *__assertion;
  ulong uVar10;
  
  iVar3 = Rtm_ObjCheckRetimeFwd(pObj);
  if (iVar3 == 0) {
    __assert_fail("Rtm_ObjCheckRetimeFwd(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigRet.c"
                  ,0x208,"void Rtm_ObjRetimeFwd(Rtm_Man_t *, Rtm_Obj_t *)");
  }
  uVar4 = *(uint *)&pObj->field_0x8;
  uVar10 = 0;
  uVar9 = 2;
  do {
    if ((uVar4 >> 7 & 0xff) <= uVar10) {
      for (iVar3 = 0; iVar3 < pObj->nFanouts; iVar3 = iVar3 + 1) {
        pRVar2 = *(Rtm_Edg_t **)
                  (&pObj[1].field_0x8 +
                  (ulong)(((*(uint *)&pObj->field_0x8 >> 7 & 0xff) + iVar3) * 2) * 8);
        if ((*(uint *)pRVar2 & 0xfff) == 10) {
          Rtm_ObjTransferToBig(pRtm,pRVar2);
        }
        else if ((~*(uint *)pRVar2 & 0xf) == 0) {
          Rtm_ObjTransferToBigger(pRtm,pRVar2);
        }
        uVar4 = *(uint *)pRVar2;
        if ((uVar4 & 0xffe) < 10) {
          uVar4 = uVar4 + 1 & 0xfff | uVar4 & 0xfffff000 |
                  (uVar9 << ((char)uVar4 * '\x02' & 0x1fU)) << 0xc;
        }
        else {
          puVar1 = (uint *)((long)pRtm->pExtra +
                           (ulong)(uVar4 >> 2 & 0x3fc) + (ulong)(uVar4 >> 0xc) * 4);
          *puVar1 = *puVar1 | uVar9 << ((char)uVar4 * '\x02' & 0x1fU);
          uVar4 = *(uint *)pRVar2 & 0xfffff000 | *(uint *)pRVar2 + 1 & 0xfff;
        }
        *(uint *)pRVar2 = uVar4;
      }
      return;
    }
    pRVar2 = (Rtm_Edg_t *)(&pObj[1].field_0x8 + uVar10 * 0x10);
    uVar4 = *(uint *)(&pObj[1].field_0x8 + uVar10 * 0x10);
    uVar7 = uVar4 & 0xfff;
    if (uVar7 < 0xb) {
      uVar6 = uVar4 >> 2 & 0x3ffff000;
      *(uint *)pRVar2 = uVar6 + uVar7;
      if (uVar7 == 0) {
        __assertion = "pEdge->nLats > 0";
        __function = "Rtm_Init_t Rtm_ObjRemFirst1(Rtm_Edg_t *)";
        uVar4 = 0x5e;
        goto LAB_0050762e;
      }
      uVar7 = uVar4 >> 0xc & 3;
      uVar4 = uVar4 - 1 & 0xfff;
      *(uint *)pRVar2 = uVar6 | uVar4;
    }
    else {
      puVar1 = pRtm->pExtra;
      *(uint *)pRVar2 = uVar4 & 0xfffff000 | uVar4 - 1 & 0xfff;
      puVar5 = puVar1 + (ulong)(uVar4 >> 0xc) +
                        (ulong)(((uVar4 >> 4 & 0xff) + 1) - (uint)((uVar4 & 0xf) == 0));
      uVar7 = 0;
      while (puVar5 = puVar5 + -1, puVar1 + (uVar4 >> 0xc) <= puVar5) {
        uVar6 = uVar7 << 0x1e;
        uVar7 = *puVar5 & 3;
        *puVar5 = uVar6 | *puVar5 >> 2;
      }
      if (uVar7 == 0) {
        __assert_fail("Val != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigRet.c"
                      ,0xed,"Rtm_Init_t Rtm_ObjRemFirst2(Rtm_Man_t *, Rtm_Edg_t *)");
      }
      uVar4 = *(uint *)pRVar2 & 0xfff;
    }
    if (uVar4 == 10) {
      Rtm_ObjTransferToSmall(pRtm,pRVar2);
    }
    uVar4 = *(uint *)&pObj->field_0x8;
    uVar6 = uVar7;
    if (((uVar4 & (uint)(uVar10 != 0) * 0x20 + 0x20) == 0) || (uVar6 = 2, uVar7 == 1)) {
      if (((uVar9 != 2) || (uVar8 = 2, uVar6 != 2)) && ((uVar8 = 1, uVar9 != 1 && (uVar6 != 1)))) {
        __assertion = "0";
        __function = "Rtm_Init_t Rtm_InitAnd(Rtm_Init_t, Rtm_Init_t)";
        uVar4 = 0x54;
        goto LAB_0050762e;
      }
    }
    else {
      uVar8 = 1;
      if (uVar7 != 2) {
        __assertion = "0";
        __function = "Rtm_Init_t Rtm_InitNot(Rtm_Init_t)";
        uVar4 = 0x52;
LAB_0050762e:
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigRet.c"
                      ,uVar4,__function);
      }
    }
    uVar10 = uVar10 + 1;
    uVar9 = uVar8;
  } while( true );
}

Assistant:

void Rtm_ObjRetimeFwd( Rtm_Man_t * pRtm, Rtm_Obj_t * pObj )
{
    Rtm_Init_t ValTotal, ValCur;
    Rtm_Edg_t * pEdge;
    int i;
    assert( Rtm_ObjCheckRetimeFwd(pObj) );
    // extract values and compute the result
    ValTotal = RTM_VAL_ONE;
    Rtm_ObjForEachFaninEdge( pObj, pEdge, i )
    {
        ValCur = Rtm_ObjRemFirst( pRtm, pEdge );
        ValCur = Rtm_InitNotCond( ValCur, i? pObj->fCompl1 : pObj->fCompl0 );
        ValTotal = Rtm_InitAnd( ValTotal, ValCur );
    }
    // insert the result in the fanout values
    Rtm_ObjForEachFanoutEdge( pObj, pEdge, i )
        Rtm_ObjAddLast( pRtm, pEdge, ValTotal );
}